

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O2

void __thiscall
curlpp::CallbackException<curlpp::UnknowException>::CallbackException
          (CallbackException<curlpp::UnknowException> *this,
          CallbackException<curlpp::UnknowException> *param_1)

{
  CallbackExceptionBase::CallbackExceptionBase
            (&this->super_CallbackExceptionBase,&param_1->super_CallbackExceptionBase);
  *(undefined ***)&(this->super_CallbackExceptionBase).super_RuntimeError =
       &PTR__CallbackException_00134cf0;
  UnknowException::UnknowException(&this->mException,&param_1->mException);
  return;
}

Assistant:

class CURLPPAPI CallbackException : public CallbackExceptionBase
	{

	public: 

		typedef CallbackException<ExceptionType> _CE;

		CallbackException(const ExceptionType & e) 
			: mException(e)
		{}

		virtual void throwMe() 
		{
			throw mException;
		}

		virtual _CE * clone() 
		{
			return new _CE(*this);
		}

	private:

		ExceptionType mException;

	}